

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_restr * lys_restr_dup(lys_module *mod,lys_restr *old,int size,int shallow,unres_schema *unres)

{
  uint8_t size_00;
  int iVar1;
  lys_restr *plVar2;
  char *pcVar3;
  lys_restr *parent;
  lys_ext_instance ***item;
  ulong uVar4;
  
  if (size != 0) {
    plVar2 = (lys_restr *)calloc((long)size,0x38);
    if (plVar2 != (lys_restr *)0x0) {
      if (size < 1) {
        return plVar2;
      }
      uVar4 = (ulong)(uint)size;
      item = &old->ext;
      parent = plVar2;
      do {
        iVar1 = unres_schema_find(unres,-1,item,UNRES_EXT);
        if (iVar1 == -1) {
          size_00 = *(uint8_t *)(item + 1);
          parent->ext_size = size_00;
          lys_ext_dup(mod->ctx,mod,*item,size_00,parent,LYEXT_PAR_RESTR,&parent->ext,shallow,unres);
        }
        pcVar3 = lydict_insert(mod->ctx,((lys_restr *)(item + -5))->expr,0);
        parent->expr = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,(char *)item[-4],0);
        parent->dsc = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,(char *)item[-3],0);
        parent->ref = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,(char *)item[-2],0);
        parent->eapptag = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,(char *)item[-1],0);
        parent->emsg = pcVar3;
        parent = parent + 1;
        item = item + 7;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      return plVar2;
    }
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_restr_dup");
  }
  return (lys_restr *)0x0;
}

Assistant:

static struct lys_restr *
lys_restr_dup(struct lys_module *mod, struct lys_restr *old, int size, int shallow, struct unres_schema *unres)
{
    struct lys_restr *result;
    int i;

    if (!size) {
        return NULL;
    }

    result = calloc(size, sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(mod->ctx), NULL);

    for (i = 0; i < size; i++) {
        /* copying unresolved extensions is not supported */
        if (unres_schema_find(unres, -1, (void *)&old[i].ext, UNRES_EXT) == -1) {
            result[i].ext_size = old[i].ext_size;
            lys_ext_dup(mod->ctx, mod, old[i].ext, old[i].ext_size, &result[i], LYEXT_PAR_RESTR, &result[i].ext, shallow, unres);
        }
        result[i].expr = lydict_insert(mod->ctx, old[i].expr, 0);
        result[i].dsc = lydict_insert(mod->ctx, old[i].dsc, 0);
        result[i].ref = lydict_insert(mod->ctx, old[i].ref, 0);
        result[i].eapptag = lydict_insert(mod->ctx, old[i].eapptag, 0);
        result[i].emsg = lydict_insert(mod->ctx, old[i].emsg, 0);
    }

    return result;
}